

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O2

void __thiscall QTipLabel::reuseTip(QTipLabel *this,QString *text,int msecDisplayTime,QPoint *pos)

{
  if (this->styleSheetParent != (QWidget *)0x0) {
    QObject::disconnect<void(QObject::*)(QObject*),void(QTipLabel::*)()>
              (&this->styleSheetParent->super_QObject,(offset_in_QObject_to_subr)QObject::destroyed,
               (Object *)0x0,(offset_in_QTipLabel_to_subr)this);
    this->styleSheetParent = (QWidget *)0x0;
  }
  QLabel::setText(&this->super_QLabel,text);
  updateSize(this,pos);
  restartExpireTimer(this,msecDisplayTime);
  return;
}

Assistant:

void QTipLabel::reuseTip(const QString &text, int msecDisplayTime, const QPoint &pos)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (styleSheetParent){
        disconnect(styleSheetParent, &QWidget::destroyed,
                   this, &QTipLabel::styleSheetParentDestroyed);
        styleSheetParent = nullptr;
    }
#endif

    setText(text);
    updateSize(pos);
    restartExpireTimer(msecDisplayTime);
}